

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * __thiscall ghc::filesystem::path::root_directory(path *__return_storage_ptr__,path *this)

{
  format fmt;
  ulong uVar2;
  path root;
  long *local_58;
  long local_50;
  long local_48 [2];
  path local_38;
  long *plVar1;
  
  root_name(&local_38,this);
  if ((local_38._path._M_string_length < (this->_path)._M_string_length) &&
     ((this->_path)._M_dataplus._M_p[local_38._path._M_string_length] == '/')) {
    local_58 = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"/","");
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    plVar1 = local_58;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)__return_storage_ptr__,local_58,local_50 + (long)local_58);
    fmt = (format)plVar1;
    if (local_58 != local_48) {
      uVar2 = local_48[0] + 1;
      operator_delete(local_58,uVar2);
      fmt = (format)uVar2;
    }
    postprocess_path_with_format(&__return_storage_ptr__->_path,fmt);
  }
  else {
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._path._M_dataplus._M_p != &local_38._path.field_2) {
    operator_delete(local_38._path._M_dataplus._M_p,local_38._path.field_2._M_allocated_capacity + 1
                   );
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::root_directory() const
{
    path root = root_name();
    if (_path.length() > root._path.length() && _path[root._path.length()] == '/') {
        return path("/");
    }
    return path();
}